

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

void slang::ast::GenvarSymbol::fromSyntax
               (Scope *parent,GenvarDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::GenvarSymbol_*> *results)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  Compilation *this;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  IdentifierNameSyntax *pIVar2;
  Symbol *this_00;
  size_t index;
  ulong uVar3;
  string_view sVar4;
  GenvarSymbol *genvar;
  Token name;
  SourceLocation local_60;
  string_view local_58;
  Token local_48;
  
  uVar3 = (syntax->identifiers).elements.size_ + 1;
  if (1 < uVar3) {
    this = parent->compilation;
    index = 0;
    do {
      pIVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::operator[]
                         (&syntax->identifiers,index);
      local_48.kind = (pIVar2->identifier).kind;
      local_48._2_1_ = (pIVar2->identifier).field_0x2;
      local_48.numFlags.raw = (pIVar2->identifier).numFlags.raw;
      local_48.rawLen = (pIVar2->identifier).rawLen;
      local_48.info = (pIVar2->identifier).info;
      sVar4 = parsing::Token::valueText(&local_48);
      if (sVar4._M_len != 0) {
        local_58 = parsing::Token::valueText(&local_48);
        local_60 = parsing::Token::location(&local_48);
        this_00 = &BumpAllocator::
                   emplace<slang::ast::GenvarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                             (&this->super_BumpAllocator,&local_58,&local_60)->super_Symbol;
        local_58._M_len = (size_t)this_00;
        this_00->originatingSyntax = (SyntaxNode *)pIVar2;
        psVar1 = &(syntax->super_MemberSyntax).attributes.
                  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
        syntax_00.data_ = psVar1->data_;
        syntax_00.size_ = psVar1->size_;
        if ((syntax->super_MemberSyntax).attributes.
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ != 0
            && psVar1->data_ == (pointer)0x0) {
          std::terminate();
        }
        Symbol::setAttributes(this_00,parent,syntax_00);
        SmallVectorBase<slang::ast::GenvarSymbol_const*>::
        emplace_back<slang::ast::GenvarSymbol_const*const&>
                  ((SmallVectorBase<slang::ast::GenvarSymbol_const*> *)results,
                   (GenvarSymbol **)&local_58);
      }
      index = index + 1;
    } while (uVar3 >> 1 != index);
  }
  return;
}

Assistant:

void GenvarSymbol::fromSyntax(const Scope& parent, const GenvarDeclarationSyntax& syntax,
                              SmallVectorBase<const GenvarSymbol*>& results) {
    auto& comp = parent.getCompilation();
    for (auto id : syntax.identifiers) {
        auto name = id->identifier;
        if (name.valueText().empty())
            continue;

        auto genvar = comp.emplace<GenvarSymbol>(name.valueText(), name.location());
        genvar->setSyntax(*id);
        genvar->setAttributes(parent, syntax.attributes);
        results.push_back(genvar);
    }
}